

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall
client_socket::impl::impl
          (impl *this,epoll *ep,file_descriptor *fd,on_ready_t *on_disconnect,
          on_ready_t *on_read_ready,on_ready_t *on_write_ready)

{
  file_descriptor *ep_00;
  int fd_00;
  uint32_t events;
  anon_class_8_1_8991fb9c local_70;
  callback_t local_68;
  on_ready_t *local_38;
  on_ready_t *on_write_ready_local;
  on_ready_t *on_read_ready_local;
  on_ready_t *on_disconnect_local;
  file_descriptor *fd_local;
  epoll *ep_local;
  impl *this_local;
  
  this->ep = ep;
  local_38 = on_write_ready;
  on_write_ready_local = on_read_ready;
  on_read_ready_local = on_disconnect;
  on_disconnect_local = (on_ready_t *)fd;
  fd_local = &ep->fd_;
  ep_local = (epoll *)this;
  file_descriptor::file_descriptor(&this->fd,fd);
  std::function<void_()>::function(&this->on_disconnect,on_disconnect);
  std::function<void_()>::function(&this->on_read_ready,on_read_ready);
  std::function<void_()>::function(&this->on_write_ready,on_write_ready);
  ep_00 = fd_local;
  fd_00 = weak_file_descriptor::getfd(&(this->fd).super_weak_file_descriptor);
  events = calculate_flags(this);
  local_70.this = this;
  std::function<void(unsigned_int)>::
  function<client_socket::impl::impl(sysapi::epoll&,file_descriptor,std::function<void()>,std::function<void()>,std::function<void()>)::__0,void>
            ((function<void(unsigned_int)> *)&local_68,&local_70);
  sysapi::epoll_registration::epoll_registration(&this->reg,(epoll *)ep_00,fd_00,events,&local_68);
  std::function<void_(unsigned_int)>::~function(&local_68);
  this->destroyed = (bool *)0x0;
  return;
}

Assistant:

client_socket::impl::impl(sysapi::epoll &ep, file_descriptor fd, on_ready_t on_disconnect, on_ready_t on_read_ready, on_ready_t on_write_ready)
    : ep(ep)
    , fd(std::move(fd))
    , on_disconnect(std::move(on_disconnect))
    , on_read_ready(std::move(on_read_ready))
    , on_write_ready(std::move(on_write_ready))
    , reg(ep, this->fd.getfd(), calculate_flags(), [this](uint32_t events) {
        assert((events & ~(EPOLLIN | EPOLLOUT | EPOLLRDHUP | EPOLLERR | EPOLLHUP)) == 0);
        bool is_destroyed = false;
        assert(destroyed == nullptr);
        destroyed = &is_destroyed;
        try
        {
            if ((events & EPOLLRDHUP)
             || (events & EPOLLERR)
             || (events & EPOLLHUP))
            {
                this->on_disconnect();
                if (is_destroyed)
                    return;
            }
            if (events & EPOLLIN)
            {
                this->on_read_ready();
                if (is_destroyed)
                    return;
            }
            if (events & EPOLLOUT)
            {
                this->on_write_ready();
                if (is_destroyed)
                    return;
            }
        }
        catch (...)
        {
            destroyed = nullptr;
            throw;
        }
        destroyed = nullptr;
    })
    , destroyed(nullptr)
{
}